

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O2

void Gia_ManCollectSuper_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSuper)

{
  int iVar1;
  
  for (; ((((ulong)pObj & 1) == 0 && ((*(ulong *)pObj >> 0x3e & 1) == 0)) &&
         (((uint)*(ulong *)pObj & 0x9fffffff) != 0x9fffffff)); pObj = Gia_ObjChild1(pObj)) {
    iVar1 = Gia_ObjIsMuxType(pObj);
    if (iVar1 != 0) break;
    Gia_ManCollectSuper_rec
              (p,(Gia_Obj_t *)
                 ((ulong)((uint)*(undefined8 *)pObj >> 0x1d & 1) |
                 (ulong)(pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff))),vSuper);
  }
  iVar1 = Gia_Obj2Lit(p,pObj);
  Vec_IntPushUnique(vSuper,iVar1);
  return;
}

Assistant:

static void Gia_ManCollectSuper_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSuper )
{
    // stop at complements, shared, PIs, and MUXes
    if ( Gia_IsComplement(pObj) || pObj->fMark1 || Gia_ObjIsCi(pObj) || Gia_ObjIsMuxType(pObj) )
    {
        Vec_IntPushUnique( vSuper, Gia_Obj2Lit(p, pObj) );
        return;
    }
    Gia_ManCollectSuper_rec( p, Gia_ObjChild0(pObj), vSuper );
    Gia_ManCollectSuper_rec( p, Gia_ObjChild1(pObj), vSuper );
}